

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getNgrams(Dictionary *this,string *word)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> submorph;
  subentry sublemma;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> subipangram;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> subngram;
  int32_t i;
  vector<int,_std::allocator<int>_> *ngrams;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *in_stack_00000308;
  subentry *in_stack_00000310;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *in_stack_00000318;
  vector<int,_std::allocator<int>_> *in_stack_00000320;
  string *in_stack_00000328;
  Dictionary *in_stack_00000330;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *in_stack_00000340;
  undefined8 in_stack_ffffffffffffff18;
  int32_t i_00;
  Dictionary *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  Dictionary *in_stack_ffffffffffffff30;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_38;
  byte local_1d;
  int32_t local_1c;
  
  i_00 = (int32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_1c = getId(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (local_1c < 0) {
    local_1d = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x150fcc);
    this_00 = &local_38;
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::vector
              ((vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)0x150fde);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::vector
              ((vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)0x150ff0);
    subentry::subentry((subentry *)0x150fff);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::vector
              ((vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)0x15100e);
    computeNgrams(in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000318,
                  in_stack_00000310,in_stack_00000308,in_stack_00000340);
    local_1d = 1;
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(this_00);
    subentry::~subentry((subentry *)0x15105d);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(this_00);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(this_00);
    if ((local_1d & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    }
  }
  else {
    getNgrams(in_stack_ffffffffffffff20,i_00);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

const std::vector<int32_t> Dictionary::getNgrams(const std::string& word) const {
  int32_t i = getId(word);
  if (i >= 0) {
    return getNgrams(i);
  }
  std::vector<int32_t> ngrams;
  std::vector<subentry> subngram;
  std::vector<subentry> subipangram;
  subentry sublemma;
  std::vector<subentry> submorph;
  computeNgrams(word, ngrams,subngram,sublemma,submorph,subipangram);
  return ngrams;
}